

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu-graphics.cpp
# Opt level: O2

string * Game::Graphics::Menu::MainMenuOptionsPrompt_abi_cxx11_(void)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  string *in_RDI;
  ostringstream str_os;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"\n");
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_53b73_00115d40 + lVar3);
    poVar2 = std::operator<<((ostream *)local_1a8,"        ");
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<((ostream *)local_1a8,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string MainMenuOptionsPrompt() {
  const auto menu_list_txt = {"1. Play a New Game", "2. Continue Previous Game",
                              "3. View Highscores and Statistics", "4. Exit"};
  constexpr auto sp = "        ";

  std::ostringstream str_os;

  str_os << "\n";
  for (const auto txt : menu_list_txt) {
    str_os << sp << txt << "\n";
  }
  str_os << "\n";

  return str_os.str();
}